

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O3

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  pointer pUVar1;
  bool bVar2;
  int iVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  UniValue *pUVar5;
  string *subnet_str;
  char *__end;
  pointer this;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CBanEntry local_90;
  int version;
  direct_or_indirect local_70;
  uint local_60;
  undefined4 uStack_5c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = UniValue::getValues(bans_json);
  this = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pUVar1 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pUVar1) {
    do {
      local_70.indirect_contents.indirect = (char *)&local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"version","");
      pUVar5 = UniValue::operator[](this,(string *)&local_70.indirect_contents);
      iVar3 = UniValue::getInt<int>(pUVar5);
      if ((uint *)local_70.indirect_contents.indirect != &local_60) {
        operator_delete(local_70.indirect_contents.indirect,CONCAT44(uStack_5c,local_60) + 1);
      }
      version = iVar3;
      if (iVar3 == 1) {
        local_70.indirect_contents.indirect = (char *)&local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"address","");
        pUVar5 = UniValue::operator[](this,(string *)&local_70.indirect_contents);
        subnet_str = UniValue::get_str_abi_cxx11_(pUVar5);
        if ((uint *)local_70.indirect_contents.indirect != &local_60) {
          operator_delete(local_70.indirect_contents.indirect,CONCAT44(uStack_5c,local_60) + 1);
        }
        LookupSubNet((CSubNet *)&local_70.indirect_contents,subnet_str);
        bVar2 = CSubNet::IsValid((CSubNet *)&local_70.indirect_contents);
        if (bVar2) {
          CBanEntry::CBanEntry(&local_90,this);
          std::
          map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::insert_or_assign<CBanEntry>(bans,(key_type *)&local_70.indirect_contents,&local_90);
        }
        else {
          logging_function_00._M_str = "BanMapFromJson";
          logging_function_00._M_len = 0xe;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
          ;
          source_file_00._M_len = 0x5d;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_00,source_file_00,0x45,ALL,Info,
                     (ConstevalFormatString<1U>)0x862598,subnet_str);
        }
        if (0x10 < local_60) {
          free(local_70.indirect_contents.indirect);
        }
      }
      else {
        logging_function._M_str = "BanMapFromJson";
        logging_function._M_len = 0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
        ;
        source_file._M_len = 0x5d;
        LogPrintFormatInternal<int>
                  (logging_function,source_file,0x3f,ALL,Info,(ConstevalFormatString<1U>)0x862560,
                   &version);
      }
      this = this + 1;
    } while (this != pUVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}